

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O3

int picnic_read_public_key(picnic_publickey_t *key,uint8_t *buf,size_t buflen)

{
  size_t __n;
  ushort uVar1;
  picnic_instance_t *ppVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = -1;
  if (buflen != 0 && (buf != (uint8_t *)0x0 && key != (picnic_publickey_t *)0x0)) {
    ppVar2 = picnic_instance_get((uint)*buf);
    if (ppVar2 != (picnic_instance_t *)0x0) {
      uVar4 = (ulong)ppVar2->input_output_size;
      __n = uVar4 * 2 + 1;
      if ((__n <= buflen) &&
         ((uVar1 = (ppVar2->lowmc).n, (uVar1 & 7) == 0 ||
          ((uVar3 = 0xff << ((uint)ppVar2->input_output_size * 8 - (uint)uVar1 & 0x1f),
           (~uVar3 & (uint)buf[uVar4]) == 0 && (((uint)buf[uVar4 * 2] & ~uVar3) == 0)))))) {
        memcpy(key,buf,__n);
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_read_public_key(picnic_publickey_t* key, const uint8_t* buf,
                                                     size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param       = buf[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const size_t bytes_required = 1 + 2 * instance->input_output_size;
  if (buflen < bytes_required) {
    return -1;
  }

#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_255_255_4)
  if (instance->lowmc.n & 0x7) {
    const unsigned int diff = instance->input_output_size * 8 - instance->lowmc.n;
    if (check_padding_bits(buf[1 + instance->input_output_size - 1], diff) ||
        check_padding_bits(buf[1 + 2 * instance->input_output_size - 1], diff)) {
      return -1;
    }
  }
#endif

  memcpy(key->data, buf, bytes_required);
  return 0;
}